

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O3

void common_ngram_cache_save(common_ngram_cache *ngram_cache,string *filename)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  int32_t count;
  llama_token token;
  int32_t ntokens;
  common_ngram_cache_part token_counts;
  pair<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  item;
  common_ngram ngram;
  ofstream file_out;
  int local_2e0;
  undefined4 local_2dc;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_>
  local_2d8;
  undefined1 local_2d0 [40];
  _Hash_node_base *p_Stack_2a8;
  __node_base_ptr local_2a0;
  _Hash_node_base *local_298;
  _Hash_node_base *p_Stack_290;
  undefined1 local_288 [40];
  _Hash_node_base *p_Stack_260;
  __node_base_ptr local_258;
  _Hash_node_base *local_248;
  _Hash_node_base *p_Stack_240;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_bin);
  p_Var2 = (ngram_cache->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_298 = p_Var2[1]._M_nxt;
      p_Stack_290 = p_Var2[2]._M_nxt;
      local_288._0_8_ = (__buckets_ptr)0x0;
      local_288._8_8_ = p_Var2[4]._M_nxt;
      local_288._16_8_ = (_Hash_node_base *)0x0;
      local_288._24_8_ = p_Var2[6]._M_nxt;
      local_288._32_8_ = p_Var2[7]._M_nxt;
      p_Stack_260 = p_Var2[8]._M_nxt;
      local_258 = (__node_base_ptr)0x0;
      local_2d0._0_8_ =
           (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)local_288;
      std::
      _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_288,
                 (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(p_Var2 + 3),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_>
                  *)local_2d0);
      local_248 = local_298;
      p_Stack_240 = p_Stack_290;
      local_2d0._0_8_ = (__buckets_ptr)0x0;
      local_2d0._8_8_ = local_288._8_8_;
      local_2d0._16_8_ = (_Hash_node_base *)0x0;
      local_2d0._24_8_ = local_288._24_8_;
      local_2d0._32_8_ = local_288._32_8_;
      p_Stack_2a8 = p_Stack_260;
      local_2a0 = (__node_base_ptr)0x0;
      local_2d8._M_h = (__hashtable_alloc *)local_2d0;
      std::
      _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_2d0,
                 (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_288,&local_2d8);
      if ((_Hash_node_base *)local_2d0._24_8_ == (_Hash_node_base *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xcd,"GGML_ASSERT(%s) failed","!token_counts.empty()");
      }
      local_2d8._M_h._0_4_ = (int)local_2d0._24_8_;
      if ((int)local_2d0._24_8_ < 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                   ,0xcf,"GGML_ASSERT(%s) failed","ntokens > 0");
      }
      std::ostream::write((char *)&local_230,(long)&local_248);
      std::ostream::write((char *)&local_230,(long)&local_2d8);
      for (p_Var1 = (_Hash_node_base *)local_2d0._16_8_; p_Var1 != (_Hash_node_base *)0x0;
          p_Var1 = p_Var1->_M_nxt) {
        local_2dc = *(undefined4 *)&p_Var1[1]._M_nxt;
        local_2e0 = *(int *)((long)&p_Var1[1]._M_nxt + 4);
        if (local_2e0 < 1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
                     ,0xd6,"GGML_ASSERT(%s) failed","count > 0");
        }
        std::ostream::write((char *)&local_230,(long)&local_2dc);
        std::ostream::write((char *)&local_230,(long)&local_2e0);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_2d0);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_288);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _ggml_backend_buft_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void common_ngram_cache_save(common_ngram_cache & ngram_cache, std::string & filename) {
    std::ofstream file_out(filename, std::ios::binary);
    for (std::pair<common_ngram, common_ngram_cache_part> item : ngram_cache) {
        const common_ngram      ngram        = item.first;
        common_ngram_cache_part token_counts = item.second;
        GGML_ASSERT(!token_counts.empty());
        const int32_t ntokens = token_counts.size();
        GGML_ASSERT(ntokens > 0);

        file_out.write(reinterpret_cast<const char *>(&ngram),   sizeof(common_ngram));
        file_out.write(reinterpret_cast<const char *>(&ntokens), sizeof(int32_t));
        for (std::pair<llama_token, int32_t> item2 : token_counts) {
            const llama_token token = item2.first;
            const int32_t     count = item2.second;
            GGML_ASSERT(count > 0);

            file_out.write(reinterpret_cast<const char *>(&token), sizeof(llama_token));
            file_out.write(reinterpret_cast<const char *>(&count), sizeof(int32_t));
        }
    }

}